

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

void __thiscall antlr::CharScanner::consume(CharScanner *this)

{
  int iVar1;
  int iVar2;
  LexerInputState *pLVar3;
  InputBuffer *pIVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long *in_RDI;
  int c;
  
  pLVar3 = RefCount<antlr::LexerInputState>::operator->
                     ((RefCount<antlr::LexerInputState> *)(in_RDI + 0xf));
  if (pLVar3->guessing == 0) {
    iVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,1);
    if ((*(byte *)(in_RDI + 7) & 1) == 0) {
      pLVar3 = RefCount<antlr::LexerInputState>::operator->
                         ((RefCount<antlr::LexerInputState> *)(in_RDI + 0xf));
      pIVar4 = LexerInputState::getInput(pLVar3);
      iVar2 = (*pIVar4->_vptr_InputBuffer[6])(pIVar4,1);
      (**(code **)(*in_RDI + 0x20))(in_RDI,(int)(char)iVar2,extraout_RDX_00,(char)iVar2);
    }
    else {
      (**(code **)(*in_RDI + 0x20))(in_RDI,(int)(char)iVar1,extraout_RDX,iVar1);
    }
    if (iVar1 == 9) {
      (**(code **)(*in_RDI + 0x118))();
    }
    else {
      pLVar3 = RefCount<antlr::LexerInputState>::operator->
                         ((RefCount<antlr::LexerInputState> *)(in_RDI + 0xf));
      pLVar3->column = pLVar3->column + 1;
    }
  }
  pLVar3 = RefCount<antlr::LexerInputState>::operator->
                     ((RefCount<antlr::LexerInputState> *)(in_RDI + 0xf));
  pIVar4 = LexerInputState::getInput(pLVar3);
  (*pIVar4->_vptr_InputBuffer[3])();
  return;
}

Assistant:

virtual void consume()
	{
		if (inputState->guessing == 0)
		{
			int c = LA(1);
			if (caseSensitive)
			{
				append(c);
			}
			else
			{
				// use input.LA(), not LA(), to get original case
				// CharScanner.LA() would toLower it.
				append(inputState->getInput().LA(1));
			}

			// RK: in a sense I don't like this automatic handling.
			if (c == '\t')
				tab();
			else
				inputState->column++;
		}
		inputState->getInput().consume();
	}